

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O0

Vec_Int_t * Acb_NtkCollectTfoSideInputs(Acb_Ntk_t *p,int Pivot,Vec_Int_t *vTfo)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  int *piVar3;
  int *pFanins;
  int iFanin;
  int Node;
  int k;
  int i;
  Vec_Int_t *vSide;
  Vec_Int_t *vTfo_local;
  int Pivot_local;
  Acb_Ntk_t *p_local;
  
  p_00 = Vec_IntAlloc(100);
  Acb_NtkIncTravId(p);
  Vec_IntPush(vTfo,Pivot);
  for (Node = 0; iVar1 = Vec_IntSize(vTfo), Node < iVar1; Node = Node + 1) {
    iVar1 = Vec_IntEntry(vTfo,Node);
    Acb_ObjSetTravIdCur(p,iVar1);
  }
  for (Node = 0; iVar1 = Vec_IntSize(vTfo), Node < iVar1; Node = Node + 1) {
    iVar1 = Vec_IntEntry(vTfo,Node);
    iFanin = 0;
    piVar3 = Acb_ObjFanins(p,iVar1);
    for (; iFanin < *piVar3; iFanin = iFanin + 1) {
      iVar1 = piVar3[iFanin + 1];
      iVar2 = Acb_ObjSetTravIdCur(p,iVar1);
      if ((iVar2 == 0) && (iVar1 != Pivot)) {
        Vec_IntPush(p_00,iVar1);
      }
    }
  }
  Vec_IntPop(vTfo);
  return p_00;
}

Assistant:

Vec_Int_t * Acb_NtkCollectTfoSideInputs( Acb_Ntk_t * p, int Pivot, Vec_Int_t * vTfo )
{
    Vec_Int_t * vSide  = Vec_IntAlloc( 100 );
    int i, k, Node, iFanin, * pFanins;
    Acb_NtkIncTravId( p );
    Vec_IntPush( vTfo, Pivot );
    Vec_IntForEachEntry( vTfo, Node, i )
        Acb_ObjSetTravIdCur( p, Node );
    Vec_IntForEachEntry( vTfo, Node, i )
        Acb_ObjForEachFaninFast( p, Node, pFanins, iFanin, k )
            if ( !Acb_ObjSetTravIdCur(p, iFanin) && iFanin != Pivot )
                Vec_IntPush( vSide, iFanin );
    Vec_IntPop( vTfo );
    return vSide;
}